

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

int main(int ac,char **av)

{
  char *pcVar1;
  bool bVar2;
  uint ac_00;
  int iVar3;
  int iVar4;
  char **av_00;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  allocator local_39d;
  undefined4 local_39c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string config;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  string local_300;
  cmake local_2e0;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc(&args);
  av_00 = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*av_00);
  if (1 < (int)ac_00) {
    pcVar1 = av_00[1];
    iVar3 = strcmp(pcVar1,"--build");
    if (iVar3 == 0) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&args_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)args_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      std::__cxx11::string::string((string *)&config,"Debug",(allocator *)&local_2e0);
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      dir._M_string_length = 0;
      dir.field_2._M_local_buf[0] = '\0';
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar3 = 1;
      uVar7 = 2;
      local_39c = 0;
      while( true ) {
        if (ac_00 == uVar7) break;
        if (iVar3 == 4) {
          std::__cxx11::string::string((string *)&local_2e0,av_00[uVar7],(allocator *)&local_300);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &nativeOptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0
                    );
          std::__cxx11::string::~string((string *)&local_2e0);
LAB_00264550:
          iVar3 = 4;
        }
        else {
          pcVar1 = av_00[uVar7];
          iVar4 = strcmp(pcVar1,"--target");
          if (iVar4 == 0) {
            iVar3 = 2;
          }
          else {
            iVar4 = strcmp(pcVar1,"--config");
            if (iVar4 == 0) {
              iVar3 = 3;
            }
            else {
              iVar4 = strcmp(pcVar1,"--clean-first");
              if (iVar4 == 0) {
                local_39c = 1;
                iVar3 = 0;
              }
              else {
                iVar4 = strcmp(pcVar1,"--use-stderr");
                if (iVar4 != 0) {
                  if (((*pcVar1 == '-') && (pcVar1[1] == '-')) && (pcVar1[2] == '\0'))
                  goto LAB_00264550;
                  psVar6 = &config;
                  if (iVar3 != 3) {
                    if (iVar3 != 2) {
                      if (iVar3 == 1) {
                        std::__cxx11::string::string((string *)&local_300,pcVar1,&local_39d);
                        cmsys::SystemTools::CollapseFullPath((string *)&local_2e0,&local_300);
                        std::__cxx11::string::operator=((string *)&dir,(string *)&local_2e0);
                        std::__cxx11::string::~string((string *)&local_2e0);
                        std::__cxx11::string::~string((string *)&local_300);
                        iVar3 = 0;
                      }
                      else {
                        poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                        poVar5 = std::operator<<(poVar5,av_00[uVar7]);
                        std::endl<char,std::char_traits<char>>(poVar5);
                        std::__cxx11::string::assign((char *)&dir);
                      }
                      goto LAB_00264637;
                    }
                    psVar6 = (string *)&args_1;
                  }
                  std::__cxx11::string::assign((char *)psVar6);
                  iVar3 = 0;
                }
              }
            }
          }
        }
LAB_00264637:
        uVar7 = uVar7 + 1;
      }
      if (dir._M_string_length == 0) {
        std::operator<<((ostream *)&std::cerr,
                        "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                       );
        iVar3 = 1;
      }
      else {
        bVar2 = cmsys::SystemTools::StringStartsWith(config._M_dataplus._M_p,".\\");
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&config);
          std::__cxx11::string::operator=((string *)&config,(string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        cmake::cmake(&local_2e0);
        iVar3 = cmake::Build(&local_2e0,&dir,(string *)&args_1,&config,&nativeOptions,
                             (bool)((byte)local_39c & 1));
        cmake::~cmake(&local_2e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&nativeOptions);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&config);
      std::__cxx11::string::~string((string *)&args_1);
      goto LAB_00264494;
    }
    if (((*pcVar1 == '-') && (pcVar1[1] == 'E')) && (pcVar1[2] == '\0')) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&args_1,(ulong)(ac_00 - 1));
      std::__cxx11::string::string((string *)&local_2e0,*av_00,(allocator *)&config);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                 (const_iterator)
                 args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,av_00 + 2,av_00 + ac_00);
      iVar3 = cmcmd::ExecuteCMakeCommand(&args_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args_1);
      goto LAB_00264494;
    }
  }
  iVar3 = do_cmake(ac_00,av_00);
  cmDynamicLoader::FlushCache();
LAB_00264494:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return iVar3;
}

Assistant:

int main(int ac, char const* const* av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if(ac > 1)
    {
    if(strcmp(av[1], "--build") == 0)
      {
      return do_build(ac, av);
      }
    else if(strcmp(av[1], "-E") == 0)
      {
      return do_command(ac, av);
      }
    }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  return ret;
}